

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::PaddedSobolSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,PaddedSobolSampler *this,int n,Allocator alloc)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  int iVar2;
  RandomizeStrategy RVar3;
  PaddedSobolSampler *pPVar4;
  ulong uVar5;
  PaddedSobolSampler *pPVar6;
  ulong uVar7;
  allocator_type local_31;
  polymorphic_allocator<std::byte> local_30;
  
  local_30.memoryResource = alloc.memoryResource;
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_31);
  pPVar4 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::PaddedSobolSampler>
                     (&local_30,(long)n);
  pPVar6 = pPVar4;
  for (uVar5 = 0; (uint)(~(n >> 0x1f) & n) != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = this->dimension;
    pPVar4->sampleIndex = this->sampleIndex;
    pPVar4->dimension = iVar2;
    uVar7 = (ulong)pPVar6 | 0x4000000000000;
    pPVar6 = pPVar6 + 1;
    RVar3 = this->randomizeStrategy;
    TVar1 = (this->pixel).super_Tuple2<pbrt::Point2,_int>;
    pPVar4->samplesPerPixel = this->samplesPerPixel;
    pPVar4->randomizeStrategy = RVar3;
    (pPVar4->pixel).super_Tuple2<pbrt::Point2,_int> = TVar1;
    pPVar4 = pPVar4 + 1;
    (__return_storage_ptr__->
    super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar5].
    super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
    .bits = uVar7;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> PaddedSobolSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    PaddedSobolSampler *samplerMem =
        (PaddedSobolSampler *)alloc.allocate_object<PaddedSobolSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}